

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

char * __thiscall gl4cts::anon_unknown_0::LinkFailure::VertexShader_fail(LinkFailure *this)

{
  return 
  "#version 430                         \nin vec4 position;                    \nvoid main(void)                      \n{                                    \n    gl_Position = position;          \n}"
  ;
}

Assistant:

virtual const char* VertexShader_fail()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = position;          \n"
			   "}";
	}